

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction *
pbrt::Triangle::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,TriangleMesh *mesh,int triIndex,
          TriangleIntersection *ti,Float time,Vector3f *wo)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar5;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int *piVar14;
  Point3f *pPVar15;
  Point2f *pPVar16;
  undefined4 uVar18;
  undefined4 uVar19;
  Normal3f *pNVar17;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Point3fi pi;
  Normal3f dndvs;
  undefined1 auVar27 [16];
  Normal3f ns;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Vector3f dpdvs;
  Vector3f dpdv;
  Vector3f dpdu;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  long lVar34;
  Vector3f *pVVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 uVar64;
  undefined1 auVar65 [56];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  initializer_list<pbrt::Point2<float>_> v;
  Vector3<float> d;
  Vector3<float> VVar78;
  Vector3<float> VVar79;
  Normal3<float> NVar80;
  Normal3<float> NVar81;
  Normal3<float> NVar82;
  Vector3<float> VVar83;
  Normal3f dndus;
  float local_248;
  float fStack_244;
  float va;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  Tuple2<pbrt::Point2,_float> local_228;
  Tuple2<pbrt::Point2,_float> local_218;
  undefined8 uStack_210;
  int vb;
  undefined1 auStack_204 [12];
  double local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Tuple3<pbrt::Vector3,_float> *local_1a0;
  long local_198;
  Tuple3<pbrt::Vector3,_float> local_190;
  Tuple3<pbrt::Vector3,_float> local_180;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  float local_154;
  float local_150;
  float local_14c;
  array<pbrt::Point2<float>,_3> uv;
  float local_128;
  float fStack_124;
  ulong local_e8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  undefined1 local_98 [16];
  double local_88;
  Vector3<float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  undefined1 local_58 [16];
  Point3fi local_48;
  undefined1 auVar66 [56];
  
  piVar14 = mesh->vertexIndices;
  pPVar15 = mesh->p;
  local_198 = (long)(triIndex * 3);
  iVar36 = piVar14[local_198 + 1];
  iVar10 = piVar14[local_198];
  iVar11 = piVar14[local_198 + 2];
  uVar61._0_4_ = pPVar15[iVar10].super_Tuple3<pbrt::Point3,_float>.x;
  uVar61._4_4_ = pPVar15[iVar10].super_Tuple3<pbrt::Point3,_float>.y;
  pPVar16 = mesh->uv;
  local_1e8 = CONCAT44(local_1e8._4_4_,pPVar15[iVar36].super_Tuple3<pbrt::Point3,_float>.z);
  uVar2._0_4_ = pPVar15[iVar36].super_Tuple3<pbrt::Point3,_float>.x;
  uVar2._4_4_ = pPVar15[iVar36].super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = pPVar15[iVar11].super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = pPVar15[iVar11].super_Tuple3<pbrt::Point3,_float>.y;
  local_218.x = pPVar15[iVar10].super_Tuple3<pbrt::Point3,_float>.z;
  fStack_1b0 = 0.0;
  fStack_1ac = 0.0;
  local_1c8 = CONCAT44(local_1c8._4_4_,pPVar15[iVar11].super_Tuple3<pbrt::Point3,_float>.z);
  if (pPVar16 == (Point2f *)0x0) {
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    va = 0.0;
    fStack_234 = 0.0;
    fStack_230 = 1.0;
    fStack_22c = 0.0;
    local_228 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar38);
  }
  else {
    va = pPVar16[iVar10].super_Tuple2<pbrt::Point2,_float>.x;
    fStack_234 = pPVar16[iVar10].super_Tuple2<pbrt::Point2,_float>.y;
    fStack_230 = pPVar16[iVar36].super_Tuple2<pbrt::Point2,_float>.x;
    fStack_22c = pPVar16[iVar36].super_Tuple2<pbrt::Point2,_float>.y;
    local_228 = pPVar16[iVar11].super_Tuple2<pbrt::Point2,_float>;
  }
  v._M_array = (iterator)&va;
  v._M_len = 3;
  local_1b8 = (float)uVar1;
  fStack_1b4 = (float)uVar5;
  local_1a0 = &wo->super_Tuple3<pbrt::Vector3,_float>;
  pstd::array<pbrt::Point2<float>,_3>::array(&uv,v);
  auVar24._4_4_ = fStack_1b4;
  auVar24._0_4_ = local_1b8;
  auVar24._8_4_ = fStack_1b0;
  auVar24._12_4_ = fStack_1ac;
  local_160.x = 0.0;
  local_160.y = 0.0;
  local_170.x = 0.0;
  local_170.y = 0.0;
  local_160.z = 0.0;
  local_170.z = 0.0;
  fVar39 = uv.values[0].super_Tuple2<pbrt::Point2,_float>.y -
           uv.values[2].super_Tuple2<pbrt::Point2,_float>.y;
  fVar22 = uv.values[1].super_Tuple2<pbrt::Point2,_float>.x -
           uv.values[2].super_Tuple2<pbrt::Point2,_float>.x;
  uVar64 = 0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar61;
  auVar38 = vsubps_avx(auVar21,auVar24);
  local_a8._0_8_ = vmovlps_avx(auVar38);
  fVar23 = local_218.x - (float)local_1c8;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar21 = vsubps_avx(auVar20,auVar24);
  local_b8._0_8_ = vmovlps_avx(auVar21);
  local_b8.z = (float)local_1e8 - (float)local_1c8;
  auVar37 = vfmsub213ss_fma(ZEXT416((uint)(uv.values[1].super_Tuple2<pbrt::Point2,_float>.y -
                                          uv.values[2].super_Tuple2<pbrt::Point2,_float>.y)),
                            ZEXT416((uint)(uv.values[0].super_Tuple2<pbrt::Point2,_float>.x -
                                          uv.values[2].super_Tuple2<pbrt::Point2,_float>.x)),
                            ZEXT416((uint)(fVar39 * fVar22)));
  auVar24 = vfnmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar22)),ZEXT416((uint)fVar39),
                             ZEXT416((uint)fVar22));
  fVar73 = auVar37._0_4_ + auVar24._0_4_;
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx512vl(ZEXT416((uint)fVar73),auVar37);
  local_a8.z = fVar23;
  if (auVar37._0_4_ < 1e-09) {
LAB_002694bc:
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar61;
    auVar29._4_4_ = fStack_1b4;
    auVar29._0_4_ = local_1b8;
    auVar29._8_4_ = fStack_1b0;
    auVar29._12_4_ = fStack_1ac;
    local_1d8 = vsubps_avx(auVar29,auVar27);
    uVar64 = vmovlps_avx(local_1d8);
    va = (float)uVar64;
    fStack_234 = (float)((ulong)uVar64 >> 0x20);
    fVar39 = (float)local_1c8 - local_218.x;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar2;
    auVar21 = vsubps_avx(auVar31,auVar27);
    _vb = (double)vmovlps_avx(auVar21);
    fVar22 = (float)local_1e8 - local_218.x;
    auVar65 = (undefined1  [56])0x0;
    auStack_204._4_4_ = fVar22;
    fStack_230 = fVar39;
    VVar79 = Cross<float>((Vector3<float> *)&va,(Vector3<float> *)&vb);
    local_180.z = VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar50._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar50._8_56_ = auVar65;
    local_180._0_8_ = vmovlps_avx(auVar50._0_16_);
    auVar43._0_4_ =
         VVar79.super_Tuple3<pbrt::Vector3,_float>.x * VVar79.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar43._4_4_ =
         VVar79.super_Tuple3<pbrt::Vector3,_float>.y * VVar79.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar43._8_4_ = auVar65._0_4_ * auVar65._0_4_;
    auVar43._12_4_ = auVar65._4_4_ * auVar65._4_4_;
    auVar38 = vhaddps_avx(auVar43,auVar43);
    fVar73 = local_180.z * local_180.z + auVar38._0_4_;
    if ((fVar73 == 0.0) && (!NAN(fVar73))) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1d8._0_8_;
      _vb = vcvtps2pd_avx(auVar6);
      local_1f8 = (double)fVar39;
      local_e8 = auVar21._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_e8;
      local_98 = vcvtps2pd_avx(auVar7);
      local_88 = (double)fVar22;
      Cross<double>((Vector3<double> *)&vb,(Vector3<double> *)local_98);
      auVar28._4_4_ = fStack_234;
      auVar28._0_4_ = va;
      auVar28._8_4_ = fStack_230;
      auVar28._12_4_ = fStack_22c;
      auVar38 = vcvtpd2ps_avx(auVar28);
      local_180.z = (float)(double)local_228;
      auVar32._12_4_ = 0;
      auVar32._0_12_ = auStack_204;
      _vb = auVar32 << 0x20;
      local_180._0_8_ = vmovlps_avx(auVar38);
      auVar67._0_4_ = auVar38._0_4_ * auVar38._0_4_;
      auVar67._4_4_ = auVar38._4_4_ * auVar38._4_4_;
      auVar67._8_4_ = auVar38._8_4_ * auVar38._8_4_;
      auVar67._12_4_ = auVar38._12_4_ * auVar38._12_4_;
      auVar38 = vhaddps_avx(auVar67,auVar67);
      va = auVar38._0_4_ + local_180.z * local_180.z;
      if ((va == 0.0) && (!NAN(va))) {
        LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.h"
                   ,0x38f,"Check failed: %s != %s with %s = %s, %s = %s",
                   (char (*) [18])"LengthSquared(ng)",(char (*) [2])0x2c92072,
                   (char (*) [18])"LengthSquared(ng)",&va,(char (*) [2])0x2c92072,&vb);
      }
    }
    auVar65 = (undefined1  [56])0x0;
    VVar79 = Normalize<float>((Vector3<float> *)&local_180);
    fStack_230 = VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar51._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar51._8_56_ = auVar65;
    uVar64 = vmovlps_avx(auVar51._0_16_);
    va = (float)uVar64;
    fStack_234 = (float)((ulong)uVar64 >> 0x20);
    CoordinateSystem<float>
              ((Vector3<float> *)&va,(Vector3<float> *)&local_160,(Vector3<float> *)&local_170);
  }
  else {
    local_1d8 = ZEXT416((uint)(1.0 / fVar73));
    VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar38._0_8_;
    VVar79.super_Tuple3<pbrt::Vector3,_float>.z = fVar23;
    VVar83.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar21._0_8_;
    VVar83.super_Tuple3<pbrt::Vector3,_float>.z = local_b8.z;
    local_154 = local_b8.z;
    local_150 = uv.values[0].super_Tuple2<pbrt::Point2,_float>.x -
                uv.values[2].super_Tuple2<pbrt::Point2,_float>.x;
    local_14c = fVar22;
    local_58 = auVar21;
    VVar78 = DifferenceOfProducts<float,pbrt::Vector3<float>,float,pbrt::Vector3<float>>
                       (uv.values[1].super_Tuple2<pbrt::Point2,_float>.y -
                        uv.values[2].super_Tuple2<pbrt::Point2,_float>.y,VVar79,fVar39,VVar83);
    auVar38 = local_58;
    uVar33 = local_1d8._0_4_;
    local_160.z = (float)local_1d8._0_4_ * VVar78.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._0_4_ = (float)local_1d8._0_4_ * VVar78.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar40._4_4_ = (float)local_1d8._0_4_ * VVar78.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar40._8_4_ = (float)local_1d8._0_4_ * (float)uVar64;
    auVar40._12_4_ = (float)local_1d8._0_4_ * (float)((ulong)uVar64 >> 0x20);
    local_160._0_8_ = vmovlps_avx(auVar40);
    uVar64 = 0;
    VVar78.super_Tuple3<pbrt::Vector3,_float>.z = local_154;
    VVar78.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_58._0_4_;
    VVar78.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_58._4_4_;
    d.super_Tuple3<pbrt::Vector3,_float>.z = fVar23;
    d.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    d.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
    local_58 = auVar38;
    VVar79 = DifferenceOfProducts<float,pbrt::Vector3<float>,float,pbrt::Vector3<float>>
                       (local_150,VVar78,local_14c,d);
    auVar41._0_4_ = VVar79.super_Tuple3<pbrt::Vector3,_float>.x * (float)uVar33;
    auVar41._4_4_ = VVar79.super_Tuple3<pbrt::Vector3,_float>.y * (float)uVar33;
    auVar41._8_4_ = (float)uVar64 * (float)uVar33;
    auVar41._12_4_ = (float)((ulong)uVar64 >> 0x20) * (float)uVar33;
    uVar64 = auVar41._8_8_;
    local_170.z = VVar79.super_Tuple3<pbrt::Vector3,_float>.z * (float)local_1d8._0_4_;
    local_170._0_8_ = vmovlps_avx(auVar41);
    VVar79 = Cross<float>((Vector3<float> *)&local_160,(Vector3<float> *)&local_170);
    auVar42._0_4_ =
         VVar79.super_Tuple3<pbrt::Vector3,_float>.x * VVar79.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar42._4_4_ =
         VVar79.super_Tuple3<pbrt::Vector3,_float>.y * VVar79.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar42._8_4_ = (float)uVar64 * (float)uVar64;
    fVar73 = (float)((ulong)uVar64 >> 0x20);
    auVar42._12_4_ = fVar73 * fVar73;
    auVar38 = vhaddps_avx(auVar42,auVar42);
    fVar73 = VVar79.super_Tuple3<pbrt::Vector3,_float>.z *
             VVar79.super_Tuple3<pbrt::Vector3,_float>.z + auVar38._0_4_;
    if ((fVar73 == 0.0) && (!NAN(fVar73))) goto LAB_002694bc;
  }
  uVar3._0_4_ = ti->b0;
  uVar3._4_4_ = ti->b1;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar3;
  fVar73 = ti->b2;
  auVar30._4_4_ = uv.values[0].super_Tuple2<pbrt::Point2,_float>.y;
  auVar30._0_4_ = uv.values[0].super_Tuple2<pbrt::Point2,_float>.x;
  auVar30._8_4_ = uv.values[1].super_Tuple2<pbrt::Point2,_float>.x;
  auVar30._12_4_ = uv.values[1].super_Tuple2<pbrt::Point2,_float>.y;
  local_1d8._0_8_ = piVar14;
  fVar39 = (float)(undefined4)uVar3 * local_218.x;
  auVar38 = vinsertps_avx(auVar30,ZEXT416((uint)uv.values[1].super_Tuple2<pbrt::Point2,_float>.y),
                          0x10);
  auVar68._0_4_ = fVar73 * local_1b8;
  auVar68._4_4_ = fVar73 * fStack_1b4;
  auVar68._8_4_ = fVar73 * fStack_1b0;
  auVar68._12_4_ = fVar73 * fStack_1ac;
  auVar21 = vmovshdup_avx(auVar74);
  fVar22 = auVar21._0_4_ * (float)local_1e8;
  auVar70._0_4_ = (float)(undefined4)uVar3 * (float)(undefined4)uVar61;
  auVar70._4_4_ = (float)(undefined4)uVar3 * (float)uVar61._4_4_;
  auVar70._8_4_ = (float)(undefined4)uVar3 * 0.0;
  auVar70._12_4_ = (float)(undefined4)uVar3 * 0.0;
  auVar71._0_4_ = auVar21._0_4_ * (float)(undefined4)uVar2;
  auVar71._4_4_ = auVar21._4_4_ * (float)uVar2._4_4_;
  auVar71._8_4_ = auVar21._8_4_ * 0.0;
  auVar71._12_4_ = auVar21._12_4_ * 0.0;
  auVar77._0_4_ = auVar70._0_4_ + auVar71._0_4_ + auVar68._0_4_;
  auVar77._4_4_ = auVar70._4_4_ + auVar71._4_4_ + auVar68._4_4_;
  auVar77._8_4_ = auVar70._8_4_ + auVar71._8_4_ + auVar68._8_4_;
  auVar77._12_4_ = auVar70._12_4_ + auVar71._12_4_ + auVar68._12_4_;
  local_98._0_8_ = vmovlps_avx(auVar77);
  local_98._8_4_ = fVar39 + fVar22 + fVar73 * (float)local_1c8;
  auVar75._0_4_ = (float)(undefined4)uVar3 * uv.values[0].super_Tuple2<pbrt::Point2,_float>.y;
  auVar75._4_4_ = (float)uVar3._4_4_ * uv.values[1].super_Tuple2<pbrt::Point2,_float>.x;
  auVar75._8_8_ = 0;
  auVar21 = vshufps_avx(auVar75,auVar75,0xe1);
  local_218.y = auVar21._4_4_ + (float)uVar3._4_4_ * auVar38._4_4_ +
                uv.values[2].super_Tuple2<pbrt::Point2,_float>.y * fVar73;
  local_218.x = auVar21._0_4_ + (float)(undefined4)uVar3 * auVar38._0_4_ +
                uv.values[2].super_Tuple2<pbrt::Point2,_float>.x * fVar73;
  uStack_210 = CONCAT44(auVar21._12_4_ + auVar38._12_4_ * 0.0 + fVar73 * 0.0,
                        auVar21._8_4_ + auVar38._8_4_ * 0.0 + fVar73 * 0.0);
  if (mesh->faceIndices == (int *)0x0) {
    iVar36 = 0;
  }
  else {
    iVar36 = mesh->faceIndices[triIndex];
  }
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  bVar8 = mesh->reverseOrientation;
  bVar9 = mesh->transformSwapsHandedness;
  auVar38 = vandps_avx(auVar70,auVar72);
  auVar21 = vandps_avx(auVar71,auVar72);
  auVar37 = vandps_avx(ZEXT416((uint)fVar39),auVar72);
  auVar24 = vandps_avx(ZEXT416((uint)fVar22),auVar72);
  auVar20 = vandps_avx(auVar68,auVar72);
  auVar40 = vandps_avx(ZEXT416((uint)(fVar73 * (float)local_1c8)),auVar72);
  auVar69._0_4_ = auVar38._0_4_ + auVar21._0_4_ + auVar20._0_4_;
  auVar69._4_4_ = auVar38._4_4_ + auVar21._4_4_ + auVar20._4_4_;
  auVar69._8_4_ = auVar38._8_4_ + auVar21._8_4_ + auVar20._8_4_;
  auVar69._12_4_ = auVar38._12_4_ + auVar21._12_4_ + auVar20._12_4_;
  auVar25._8_4_ = 0x34e00006;
  auVar25._0_8_ = 0x34e0000634e00006;
  auVar25._12_4_ = 0x34e00006;
  auVar38 = vmulps_avx512vl(auVar69,auVar25);
  local_180.z = (auVar37._0_4_ + auVar24._0_4_ + auVar40._0_4_) * 4.1723268e-07;
  local_180._0_8_ = vmovlps_avx(auVar38);
  Point3fi::Point3fi(&local_48,(Point3f *)local_98,(Vector3f *)&local_180);
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_160.z;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_160.x;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_160.y;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = local_170.z;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = local_170.x;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = local_170.y;
  va = 0.0;
  fStack_234 = 0.0;
  fStack_230 = 0.0;
  _vb = (Tuple3<pbrt::Vector3,_float>)ZEXT812(0);
  auVar65 = ZEXT856(uStack_210);
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,pi,(Point2f)local_218,(Vector3f)*local_1a0,dpdu,dpdv,
             (Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),time,bVar8 != bVar9);
  __return_storage_ptr__->faceIndex = iVar36;
  VVar79 = Cross<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_b8);
  fStack_230 = VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar52._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar52._8_56_ = auVar65;
  uVar64 = vmovlps_avx(auVar52._0_16_);
  va = (float)uVar64;
  fStack_234 = (float)((ulong)uVar64 >> 0x20);
  VVar79 = Normalize<float>((Vector3<float> *)&va);
  auVar53._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar53._8_56_ = auVar65;
  uVar64 = vmovlps_avx(auVar53._0_16_);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar64;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar64 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
  pNVar17 = &(__return_storage_ptr__->super_Interaction).n;
  fVar73 = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar73;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  if (mesh->reverseOrientation != mesh->transformSwapsHandedness) {
    NVar80 = Tuple3<pbrt::Normal3,_float>::operator-(&pNVar17->super_Tuple3<pbrt::Normal3,_float>);
    auVar54._0_8_ = NVar80.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar54._8_56_ = auVar65;
    uVar64 = vmovlps_avx(auVar54._0_16_);
    (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar64;
    (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar64 >> 0x20);
    (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar80.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar73 = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    (pNVar17->super_Tuple3<pbrt::Normal3,_float>).x =
         (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    (pNVar17->super_Tuple3<pbrt::Normal3,_float>).y = fVar73;
    (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  lVar34 = local_198;
  uVar64 = local_1d8._0_8_;
  if (mesh->n == (Normal3f *)0x0) {
    pVVar35 = mesh->s;
    if (pVVar35 == (Vector3f *)0x0) {
      return __return_storage_ptr__;
    }
    fStack_230 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar12 = (pNVar17->super_Tuple3<pbrt::Normal3,_float>).x;
    uVar18 = (pNVar17->super_Tuple3<pbrt::Normal3,_float>).y;
    va = (float)uVar12;
    fStack_234 = (float)uVar18;
  }
  else {
    va = 0.0;
    fStack_234 = 0.0;
    fStack_230 = 0.0;
    uVar61 = 0;
    NVar80 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)
                        (mesh->n + *(int *)(local_1d8._0_8_ + local_198 * 4)),ti->b0);
    local_218 = NVar80.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    uVar62 = 0;
    uStack_210 = uVar61;
    NVar81 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)(mesh->n + *(int *)(uVar64 + 4 + lVar34 * 4))
                        ,ti->b1);
    local_1e8 = NVar81.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    uVar63 = 0;
    uStack_1e0 = uVar62;
    NVar82 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)(mesh->n + *(int *)(uVar64 + 8 + lVar34 * 4))
                        ,ti->b2);
    fStack_230 = NVar82.super_Tuple3<pbrt::Normal3,_float>.z +
                 NVar81.super_Tuple3<pbrt::Normal3,_float>.z +
                 NVar80.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar44._0_4_ = (float)local_1e8 + local_218.x + NVar82.super_Tuple3<pbrt::Normal3,_float>.x;
    auVar44._4_4_ = local_1e8._4_4_ + local_218.y + NVar82.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar44._8_4_ = (float)uStack_1e0 + (float)uStack_210 + (float)uVar63;
    auVar44._12_4_ = uStack_1e0._4_4_ + uStack_210._4_4_ + (float)((ulong)uVar63 >> 0x20);
    uVar62 = vmovlps_avx(auVar44);
    va = (float)uVar62;
    fStack_234 = (float)((ulong)uVar62 >> 0x20);
    auVar45._0_4_ = auVar44._0_4_ * auVar44._0_4_;
    auVar45._4_4_ = auVar44._4_4_ * auVar44._4_4_;
    auVar45._8_4_ = auVar44._8_4_ * auVar44._8_4_;
    auVar45._12_4_ = auVar44._12_4_ * auVar44._12_4_;
    auVar38 = vhaddps_avx(auVar45,auVar45);
    auVar65 = (undefined1  [56])0x0;
    if (fStack_230 * fStack_230 + auVar38._0_4_ <= 0.0) {
      uVar4._0_4_ = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>
                    .x;
      uVar4._4_4_ = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>
                    .y;
      auVar55 = ZEXT864(uVar4);
      fStack_230 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.
                   z;
    }
    else {
      NVar80 = Normalize<float>((Normal3<float> *)&va);
      fStack_230 = NVar80.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar55._0_8_ = NVar80.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar55._8_56_ = auVar65;
    }
    auVar65 = auVar55._8_56_;
    uVar62 = vmovlps_avx(auVar55._0_16_);
    va = (float)uVar62;
    fStack_234 = (float)((ulong)uVar62 >> 0x20);
    pVVar35 = mesh->s;
  }
  _vb = (Tuple3<pbrt::Vector3,_float>)ZEXT812(0);
  if (pVVar35 != (Vector3f *)0x0) {
    uVar61 = 0;
    VVar79 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,float> *)(pVVar35 + *(int *)(uVar64 + lVar34 * 4)),
                        ti->b0);
    local_218 = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    uVar62 = 0;
    uStack_210 = uVar61;
    VVar78 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,float> *)(mesh->s + *(int *)(uVar64 + 4 + lVar34 * 4))
                        ,ti->b1);
    local_1e8 = VVar78.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    uVar63 = 0;
    uStack_1e0 = uVar62;
    VVar83 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,float> *)(mesh->s + *(int *)(uVar64 + 8 + lVar34 * 4))
                        ,ti->b2);
    fVar73 = VVar83.super_Tuple3<pbrt::Vector3,_float>.z +
             VVar78.super_Tuple3<pbrt::Vector3,_float>.z +
             VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar46._0_4_ = (float)local_1e8 + local_218.x + VVar83.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar46._4_4_ = local_1e8._4_4_ + local_218.y + VVar83.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar46._8_4_ = (float)uStack_1e0 + (float)uStack_210 + (float)uVar63;
    auVar46._12_4_ = uStack_1e0._4_4_ + uStack_210._4_4_ + (float)((ulong)uVar63 >> 0x20);
    uVar62 = vmovlps_avx(auVar46);
    auVar47._0_4_ = auVar46._0_4_ * auVar46._0_4_;
    auVar47._4_4_ = auVar46._4_4_ * auVar46._4_4_;
    auVar47._8_4_ = auVar46._8_4_ * auVar46._8_4_;
    auVar47._12_4_ = auVar46._12_4_ * auVar46._12_4_;
    auStack_204._4_4_ = fVar73;
    _vb = (double)uVar62;
    auVar38 = vhaddps_avx(auVar47,auVar47);
    fVar73 = fVar73 * fVar73 + auVar38._0_4_;
    auVar66 = (undefined1  [56])0x0;
    if ((fVar73 != 0.0) || (auVar65 = (undefined1  [56])0x0, NAN(fVar73))) goto LAB_00269aa8;
  }
  auVar66 = auVar65;
  auVar38 = _vb;
  uVar13 = (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar19 = (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  auStack_204._0_4_ = uVar19;
  vb = uVar13;
  uVar62 = _vb;
  auStack_204._8_4_ = auVar38._12_4_;
  _vb = auVar38._0_8_;
  auStack_204._4_4_ = (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z;
  _vb = CONCAT88(auStack_204._4_8_,uVar62);
LAB_00269aa8:
  VVar79 = Cross<float>((Normal3<float> *)&va,(Vector3<float> *)&vb);
  local_190.z = VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar56._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar56._8_56_ = auVar66;
  local_190._0_8_ = vmovlps_avx(auVar56._0_16_);
  auVar48._0_4_ =
       VVar79.super_Tuple3<pbrt::Vector3,_float>.x * VVar79.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar48._4_4_ =
       VVar79.super_Tuple3<pbrt::Vector3,_float>.y * VVar79.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar48._8_4_ = auVar66._0_4_ * auVar66._0_4_;
  auVar48._12_4_ = auVar66._4_4_ * auVar66._4_4_;
  auVar38 = vhaddps_avx(auVar48,auVar48);
  auVar65 = (undefined1  [56])0x0;
  if (local_190.z * local_190.z + auVar38._0_4_ <= 0.0) {
    CoordinateSystem<float>
              ((Normal3<float> *)&va,(Vector3<float> *)&vb,(Vector3<float> *)&local_190);
  }
  else {
    VVar79 = Cross<float>((Vector3<float> *)&local_190,(Normal3<float> *)&va);
    auVar57._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar57._8_56_ = auVar65;
    uVar62 = vmovlps_avx(auVar57._0_16_);
    auStack_204._4_4_ = VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
    _vb = (double)uVar62;
  }
  pNVar17 = mesh->n;
  if (pNVar17 == (Normal3f *)0x0) {
    fVar73 = 0.0;
    auVar76 = ZEXT816(0) << 0x40;
    uVar64._0_4_ = 0.0;
    uVar64._4_4_ = 0.0;
    fVar39 = 0.0;
  }
  else {
    local_218.x = uv.values[0].super_Tuple2<pbrt::Point2,_float>.x -
                  uv.values[2].super_Tuple2<pbrt::Point2,_float>.x;
    local_1e8 = CONCAT44(local_1e8._4_4_,
                         uv.values[1].super_Tuple2<pbrt::Point2,_float>.x -
                         uv.values[2].super_Tuple2<pbrt::Point2,_float>.x);
    local_1b8 = uv.values[0].super_Tuple2<pbrt::Point2,_float>.y -
                uv.values[2].super_Tuple2<pbrt::Point2,_float>.y;
    uVar62 = 0;
    local_1c8 = CONCAT44(local_1c8._4_4_,
                         uv.values[1].super_Tuple2<pbrt::Point2,_float>.y -
                         uv.values[2].super_Tuple2<pbrt::Point2,_float>.y);
    NVar80 = Tuple3<pbrt::Normal3,float>::operator-
                       (&pNVar17[*(int *)(uVar64 + lVar34 * 4)].super_Tuple3<pbrt::Normal3,_float>,
                        pNVar17 + *(int *)(uVar64 + 8 + lVar34 * 4));
    NVar81 = Tuple3<pbrt::Normal3,float>::operator-
                       (&mesh->n[*(int *)(uVar64 + 4 + lVar34 * 4)].
                         super_Tuple3<pbrt::Normal3,_float>,
                        mesh->n + *(int *)(uVar64 + 8 + lVar34 * 4));
    fVar73 = (float)local_1c8;
    auVar38 = vfmsub132ss_fma(ZEXT416((uint)(float)local_1c8),
                              ZEXT416((uint)(local_1b8 * (float)local_1e8)),
                              ZEXT416((uint)local_218.x));
    auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(local_1b8 * (float)local_1e8)),
                               ZEXT416((uint)local_1b8),ZEXT416((uint)(float)local_1e8));
    fVar39 = auVar38._0_4_ + auVar21._0_4_;
    auVar65 = (undefined1  [56])0x0;
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx512vl(ZEXT416((uint)fVar39),auVar26);
    if (1e-09 <= auVar38._0_4_) {
      local_198 = CONCAT44(local_198._4_4_,NVar81.super_Tuple3<pbrt::Normal3,_float>.z);
      fVar39 = 1.0 / fVar39;
      local_1c8 = NVar81.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      uStack_1c0 = uVar62;
      NVar82 = DifferenceOfProducts<float,pbrt::Normal3<float>,float,pbrt::Normal3<float>>
                         (fVar73,NVar80,local_1b8,NVar81);
      local_1a0 = (Tuple3<pbrt::Vector3,_float> *)
                  CONCAT44(local_1a0._4_4_,fVar39 * NVar82.super_Tuple3<pbrt::Normal3,_float>.z);
      uVar64 = 0;
      NVar81.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_198;
      NVar81.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_1c8;
      NVar81.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_1c8._4_4_;
      local_1b8 = fVar39;
      fStack_1b4 = fVar39;
      fStack_1b0 = fVar39;
      fStack_1ac = fVar39;
      NVar80 = DifferenceOfProducts<float,pbrt::Normal3<float>,float,pbrt::Normal3<float>>
                         (local_218.x,NVar81,(float)local_1e8,NVar80);
      auVar76._0_4_ = NVar80.super_Tuple3<pbrt::Normal3,_float>.x * local_1b8;
      auVar76._4_4_ = NVar80.super_Tuple3<pbrt::Normal3,_float>.y * fStack_1b4;
      auVar76._8_4_ = (float)uVar64 * fStack_1b0;
      auVar76._12_4_ = (float)((ulong)uVar64 >> 0x20) * fStack_1ac;
      fVar73 = NVar80.super_Tuple3<pbrt::Normal3,_float>.z * fVar39;
      uVar64._4_4_ = fVar39 * NVar82.super_Tuple3<pbrt::Normal3,_float>.y;
      uVar64._0_4_ = fVar39 * NVar82.super_Tuple3<pbrt::Normal3,_float>.x;
      fVar39 = local_1a0._0_4_;
    }
    else {
      NVar80 = Tuple3<pbrt::Normal3,float>::operator-
                         (&mesh->n[*(int *)(uVar64 + 8 + lVar34 * 4)].
                           super_Tuple3<pbrt::Normal3,_float>,
                          mesh->n + *(int *)(uVar64 + lVar34 * 4));
      local_68.z = NVar80.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar58._0_8_ = NVar80.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar58._8_56_ = auVar65;
      local_68._0_8_ = vmovlps_avx(auVar58._0_16_);
      NVar80 = Tuple3<pbrt::Normal3,float>::operator-
                         (&mesh->n[*(int *)(uVar64 + 4 + lVar34 * 4)].
                           super_Tuple3<pbrt::Normal3,_float>,
                          mesh->n + *(int *)(uVar64 + lVar34 * 4));
      local_78.super_Tuple3<pbrt::Vector3,_float>.z = NVar80.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar59._0_8_ = NVar80.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar59._8_56_ = auVar65;
      local_78.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar59._0_16_);
      VVar79 = Cross<float>((Vector3<float> *)&local_68,&local_78);
      local_c8.z = VVar79.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar60._0_8_ = VVar79.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar60._8_56_ = auVar65;
      local_c8._0_8_ = vmovlps_avx(auVar60._0_16_);
      auVar49._0_4_ =
           VVar79.super_Tuple3<pbrt::Vector3,_float>.x * VVar79.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar49._4_4_ =
           VVar79.super_Tuple3<pbrt::Vector3,_float>.y * VVar79.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar49._8_4_ = auVar65._0_4_ * auVar65._0_4_;
      auVar49._12_4_ = auVar65._4_4_ * auVar65._4_4_;
      auVar76 = ZEXT816(0) << 0x40;
      uVar64._0_4_ = 0.0;
      uVar64._4_4_ = 0.0;
      auVar38 = vhaddps_avx(auVar49,auVar49);
      fVar22 = local_c8.z * local_c8.z + auVar38._0_4_;
      if ((fVar22 != 0.0) || (fVar73 = 0.0, fVar39 = 0.0, NAN(fVar22))) {
        local_68.x = 0.0;
        local_68.y = 0.0;
        local_78.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_78.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_68.z = 0.0;
        local_78.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        CoordinateSystem<float>((Vector3<float> *)&local_c8,(Vector3<float> *)&local_68,&local_78);
        auVar76._8_8_ = 0;
        auVar76._0_4_ = local_78.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar76._4_4_ = local_78.super_Tuple3<pbrt::Vector3,_float>.y;
        fVar73 = local_78.super_Tuple3<pbrt::Vector3,_float>.z;
        fVar39 = local_68.z;
        uVar64 = local_68._0_8_;
      }
    }
  }
  ns.super_Tuple3<pbrt::Normal3,_float>.y = fStack_234;
  ns.super_Tuple3<pbrt::Normal3,_float>.x = va;
  ns.super_Tuple3<pbrt::Normal3,_float>.z = fStack_230;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = local_190.z;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>.x = local_190.x;
  dpdvs.super_Tuple3<pbrt::Vector3,_float>.y = local_190.y;
  uVar62 = vmovlps_avx(auVar76);
  dndvs.super_Tuple3<pbrt::Normal3,_float>.z = fVar73;
  dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar62;
  dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar62 >> 0x20);
  dndus.super_Tuple3<pbrt::Normal3,_float>.z = fVar39;
  dndus.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar64;
  dndus.super_Tuple3<pbrt::Normal3,_float>.y = SUB84(uVar64,4);
  SurfaceInteraction::SetShadingGeometry
            (__return_storage_ptr__,ns,(Vector3f)_vb,dpdvs,dndus,dndvs,true);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const TriangleMesh *mesh,
                                                          int triIndex,
                                                          const TriangleIntersection &ti,
                                                          Float time,
                                                          const Vector3f &wo) {
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];
        // Compute triangle partial derivatives
        // Compute deltas and matrix determinant for triangle partial derivatives
        // Get triangle texture coordinates in _uv_ array
        pstd::array<Point2f, 3> uv =
            mesh->uv
                ? pstd::array<Point2f, 3>(
                      {mesh->uv[v[0]], mesh->uv[v[1]], mesh->uv[v[2]]})
                : pstd::array<Point2f, 3>({Point2f(0, 0), Point2f(1, 0), Point2f(1, 1)});

        Vector2f duv02 = uv[0] - uv[2], duv12 = uv[1] - uv[2];
        Vector3f dp02 = p0 - p2, dp12 = p1 - p2;
        Float determinant = DifferenceOfProducts(duv02[0], duv12[1], duv02[1], duv12[0]);

        Vector3f dpdu, dpdv;
        bool degenerateUV = std::abs(determinant) < 1e-9f;
        if (!degenerateUV) {
            // Compute triangle $\dpdu$ and $\dpdv$ via matrix inversion
            Float invdet = 1 / determinant;
            dpdu = DifferenceOfProducts(duv12[1], dp02, duv02[1], dp12) * invdet;
            dpdv = DifferenceOfProducts(duv02[0], dp12, duv12[0], dp02) * invdet;
        }
        // Handle degenerate triangle $(u,v)$ parameterization or partial derivatives
        if (degenerateUV || LengthSquared(Cross(dpdu, dpdv)) == 0) {
            Vector3f ng = Cross(p2 - p0, p1 - p0);
            if (LengthSquared(ng) == 0) {
                ng = Vector3f(Cross(Vector3<double>(p2 - p0), Vector3<double>(p1 - p0)));
                CHECK_NE(LengthSquared(ng), 0);
            }
            CoordinateSystem(Normalize(ng), &dpdu, &dpdv);
        }

        // Interpolate $(u,v)$ parametric coordinates and hit point
        Point3f pHit = ti.b0 * p0 + ti.b1 * p1 + ti.b2 * p2;
        Point2f uvHit = ti.b0 * uv[0] + ti.b1 * uv[1] + ti.b2 * uv[2];

        // Return _SurfaceInteraction_ for triangle hit
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[triIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        // Compute error bounds _pError_ for triangle intersection
        Float xAbsSum =
            (std::abs(ti.b0 * p0.x) + std::abs(ti.b1 * p1.x) + std::abs(ti.b2 * p2.x));
        Float yAbsSum =
            (std::abs(ti.b0 * p0.y) + std::abs(ti.b1 * p1.y) + std::abs(ti.b2 * p2.y));
        Float zAbsSum =
            (std::abs(ti.b0 * p0.z) + std::abs(ti.b1 * p1.z) + std::abs(ti.b2 * p2.z));
        Vector3f pError = gamma(7) * Vector3f(xAbsSum, yAbsSum, zAbsSum);

        SurfaceInteraction isect(Point3fi(pHit, pError), uvHit, wo, dpdu, dpdv,
                                 Normal3f(), Normal3f(), time, flipNormal, faceIndex);
        // Set final surface normal and shading geometry for triangle
        // Override surface normal in _isect_ for triangle
        isect.n = isect.shading.n = Normal3f(Normalize(Cross(dp02, dp12)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            isect.n = isect.shading.n = -isect.n;

        if (mesh->n || mesh->s) {
            // Initialize _Triangle_ shading geometry
            // Compute shading normal _ns_ for triangle
            Normal3f ns;
            if (mesh->n != nullptr) {
                ns =
                    ti.b0 * mesh->n[v[0]] + ti.b1 * mesh->n[v[1]] + ti.b2 * mesh->n[v[2]];
                ns = LengthSquared(ns) > 0 ? Normalize(ns) : isect.n;
            } else
                ns = isect.n;

            // Compute shading tangent _ss_ for triangle
            Vector3f ss;
            if (mesh->s != nullptr) {
                ss =
                    ti.b0 * mesh->s[v[0]] + ti.b1 * mesh->s[v[1]] + ti.b2 * mesh->s[v[2]];
                if (LengthSquared(ss) == 0)
                    ss = isect.dpdu;
            } else
                ss = isect.dpdu;

            // Compute shading bitangent _ts_ for triangle and adjust _ss_
            Vector3f ts = Cross(ns, ss);
            if (LengthSquared(ts) > 0)
                ss = Cross(ts, ns);
            else
                CoordinateSystem(ns, &ss, &ts);

            // Compute $\dndu$ and $\dndv$ for triangle shading geometry
            Normal3f dndu, dndv;
            if (mesh->n != nullptr) {
                // Compute deltas for triangle partial derivatives of normal
                Vector2f duv02 = uv[0] - uv[2];
                Vector2f duv12 = uv[1] - uv[2];
                Normal3f dn1 = mesh->n[v[0]] - mesh->n[v[2]];
                Normal3f dn2 = mesh->n[v[1]] - mesh->n[v[2]];

                Float determinant =
                    DifferenceOfProducts(duv02[0], duv12[1], duv02[1], duv12[0]);
                bool degenerateUV = std::abs(determinant) < 1e-9;
                if (degenerateUV) {
                    // We can still compute dndu and dndv, with respect to the
                    // same arbitrary coordinate system we use to compute dpdu
                    // and dpdv when this happens. It's important to do this
                    // (rather than giving up) so that ray differentials for
                    // rays reflected from triangles with degenerate
                    // parameterizations are still reasonable.
                    Vector3f dn = Cross(Vector3f(mesh->n[v[2]] - mesh->n[v[0]]),
                                        Vector3f(mesh->n[v[1]] - mesh->n[v[0]]));

                    if (LengthSquared(dn) == 0)
                        dndu = dndv = Normal3f(0, 0, 0);
                    else {
                        Vector3f dnu, dnv;
                        CoordinateSystem(dn, &dnu, &dnv);
                        dndu = Normal3f(dnu);
                        dndv = Normal3f(dnv);
                    }
                } else {
                    Float invDet = 1 / determinant;
                    dndu = DifferenceOfProducts(duv12[1], dn1, duv02[1], dn2) * invDet;
                    dndv = DifferenceOfProducts(duv02[0], dn2, duv12[0], dn1) * invDet;
                }
            } else
                dndu = dndv = Normal3f(0, 0, 0);

            isect.SetShadingGeometry(ns, ss, ts, dndu, dndv, true);
        }

        return isect;
    }